

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O1

void __thiscall
deci::parser_t::basic_symbol<deci::parser_t::by_state>::move
          (basic_symbol<deci::parser_t::by_state> *this,basic_symbol<deci::parser_t::by_state> *s)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  int iVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  
  (this->super_by_state).state = (s->super_by_state).state;
  (s->super_by_state).state = '\0';
  lVar7 = (long)(this->super_by_state).state;
  if (lVar7 == 0) {
    iVar6 = -2;
  }
  else {
    iVar6 = (int)(char)yystos_[lVar7];
  }
  switch(iVar6) {
  case 3:
    value_type::move<double>(&this->value,&s->value);
    break;
  case 4:
  case 0x39:
    u = value_type::as<std::__cxx11::string>(&s->value);
    value_type::emplace<std::__cxx11::string,std::__cxx11::string>(&this->value,u);
    value_type::destroy<std::__cxx11::string>(&s->value);
    break;
  case 0x2a:
  case 0x3f:
    value_type::move<deci::ast_arg_list_t*>(&this->value,&s->value);
    break;
  case 0x2b:
  case 0x2e:
    value_type::move<deci::ast_t*>(&this->value,&s->value);
    break;
  case 0x2f:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
    value_type::move<deci::ast_item_t*>(&this->value,&s->value);
    break;
  case 0x30:
    value_type::move<deci::ast_exit_t*>(&this->value,&s->value);
  }
  pfVar1 = (s->location).begin.filename;
  cVar4 = (s->location).begin.line;
  cVar5 = (s->location).begin.column;
  cVar2 = (s->location).end.line;
  cVar3 = (s->location).end.column;
  (this->location).end.filename = (s->location).end.filename;
  (this->location).end.line = cVar2;
  (this->location).end.column = cVar3;
  (this->location).begin.filename = pfVar1;
  (this->location).begin.line = cVar4;
  (this->location).begin.column = cVar5;
  return;
}

Assistant:

void
   parser_t ::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.move< ast_arg_list_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.move< ast_exit_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.move< ast_item_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.move< ast_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.move< double > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.move< std::string > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }